

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer.cc
# Opt level: O3

void __thiscall
wabt::anon_unknown_1::BinaryWriter::WriteExceptType(BinaryWriter *this,TypeVector *except_types)

{
  Type *pTVar1;
  Type *pTVar2;
  
  WriteU32Leb128(this->stream_,
                 (uint32_t)
                 ((ulong)((long)(except_types->
                                super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl
                                .super__Vector_impl_data._M_finish -
                         (long)(except_types->
                               super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
                               super__Vector_impl_data._M_start) >> 2),"exception type count");
  pTVar1 = (except_types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (pTVar2 = (except_types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
                super__Vector_impl_data._M_start; pTVar2 != pTVar1; pTVar2 = pTVar2 + 1) {
    WriteType(this->stream_,*pTVar2);
  }
  return;
}

Assistant:

void BinaryWriter::WriteExceptType(const TypeVector* except_types) {
  WriteU32Leb128(stream_, except_types->size(), "exception type count");
  for (Type ty : *except_types) {
    WriteType(stream_, ty);
  }
}